

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::anon_unknown_0::ExtensionSetTest_DynamicExtensions_Test::TestBody
          (ExtensionSetTest_DynamicExtensions_Test *this)

{
  uint uVar1;
  pointer pcVar2;
  undefined1 auVar3 [8];
  undefined8 uVar4;
  bool bVar5;
  internal iVar6;
  int iVar7;
  void *pvVar8;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *pVVar9;
  string *psVar10;
  DescriptorPool *underlay;
  FileDescriptor *this_00;
  FieldDescriptor *pFVar11;
  Message *pMVar12;
  long lVar13;
  long lVar14;
  AssertHelperData *pAVar15;
  Descriptor *type;
  Arena *pAVar16;
  pointer *__ptr;
  size_type __rlen;
  InternalMetadata IVar17;
  UnknownFieldSet *pUVar18;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  AlphaNum *c;
  char *pcVar19;
  char *in_R9;
  pointer *__ptr_2;
  pointer *__ptr_5;
  int iVar20;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view name;
  string_view name_00;
  Metadata MVar21;
  Metadata MVar22;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar__4;
  ArrayInputStream raw_input;
  string message_text;
  string data;
  DynamicMessageFactory dynamic_factory;
  TestAllExtensions message;
  TestDynamicExtensions dynamic_extension;
  DescriptorPool dynamic_pool;
  FileDescriptorProto dynamic_proto;
  DescriptorProto template_descriptor_proto;
  string local_4b8;
  undefined1 local_498 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_490;
  Message local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_470;
  undefined1 local_468 [8];
  InternalMetadata IStack_460;
  undefined1 local_458 [32];
  anon_union_16_2_b9f6da03_for_SooRep_0 local_438 [3];
  undefined4 local_408;
  AssertHelper local_400;
  undefined1 local_3f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  undefined1 local_3d8 [8];
  InternalMetadata local_3d0;
  string local_3a8;
  string local_388;
  undefined1 local_368 [64];
  TestAllExtensions local_328;
  TestDynamicExtensions local_2f8;
  DescriptorPool local_290;
  undefined1 local_218 [48];
  RepeatedPtrFieldBase local_1e8;
  RepeatedPtrFieldBase local_1d0 [2];
  RepeatedPtrFieldBase local_1a0 [3];
  ArenaStringPtr local_150;
  ArenaStringPtr local_148 [5];
  undefined1 local_120 [48];
  RepeatedPtrFieldBase local_f0;
  RepeatedPtrFieldBase local_d8 [7];
  undefined4 extraout_var;
  
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_218,(Arena *)0x0);
  MVar21 = proto2_unittest::TestDynamicExtensions::GetMetadata
                     ((TestDynamicExtensions *)
                      proto2_unittest::_TestDynamicExtensions_default_instance_);
  FileDescriptor::CopyHeadingTo((MVar21.descriptor)->file_,(FileDescriptorProto *)local_218);
  RepeatedPtrFieldBase::Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            ((RepeatedPtrFieldBase *)(local_218 + 0x18));
  local_218[0x10] = local_218[0x10] | 1;
  pAVar16 = (Arena *)local_218._8_8_;
  if ((local_218._8_8_ & 1) != 0) {
    pAVar16 = *(Arena **)(local_218._8_8_ & 0xfffffffffffffffe);
  }
  value._M_str = "dynamic_extensions_test.proto";
  value._M_len = 0x1d;
  ArenaStringPtr::Set(&local_150,value,pAVar16);
  MVar21 = proto2_unittest::TestAllExtensions::GetMetadata
                     ((TestAllExtensions *)proto2_unittest::_TestAllExtensions_default_instance_);
  psVar10 = (MVar21.descriptor)->file_->name_;
  pcVar2 = (psVar10->_M_dataplus)._M_p;
  c = (AlphaNum *)psVar10->_M_string_length;
  pvVar8 = RepeatedPtrFieldBase::AddString((RepeatedPtrFieldBase *)(local_218 + 0x18));
  std::__cxx11::string::_M_replace((ulong)pvVar8,0,*(char **)((long)pvVar8 + 8),(ulong)pcVar2);
  local_218[0x10] = local_218[0x10] | 2;
  if ((local_218._8_8_ & 1) != 0) {
    local_218._8_8_ = *(undefined8 *)(local_218._8_8_ & 0xfffffffffffffffe);
  }
  value_00._M_str = "dynamic_extensions";
  value_00._M_len = 0x12;
  ArenaStringPtr::Set(local_148,value_00,(Arena *)local_218._8_8_);
  MVar21 = proto2_unittest::TestDynamicExtensions::GetMetadata
                     ((TestDynamicExtensions *)
                      proto2_unittest::_TestDynamicExtensions_default_instance_);
  DescriptorProto::DescriptorProto((DescriptorProto *)local_120,(Arena *)0x0);
  Descriptor::CopyTo(MVar21.descriptor,(DescriptorProto *)local_120);
  if (local_f0.current_size_ != 0) {
    RepeatedPtrFieldBase::MergeFromConcreteMessage
              (&local_1e8,&local_f0,Arena::CopyConstruct<google::protobuf::DescriptorProto>);
  }
  if (local_d8[0].current_size_ != 0) {
    RepeatedPtrFieldBase::MergeFromConcreteMessage
              (local_1d0,local_d8,Arena::CopyConstruct<google::protobuf::EnumDescriptorProto>);
  }
  if (local_120._32_4_ != 0) {
    RepeatedPtrFieldBase::MergeFromConcreteMessage
              (local_1a0,(RepeatedPtrFieldBase *)(local_120 + 0x18),
               Arena::CopyConstruct<google::protobuf::FieldDescriptorProto>);
  }
  if (0 < local_1a0[0].current_size_) {
    iVar20 = 0;
    do {
      pVVar9 = RepeatedPtrFieldBase::
               Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                         (local_1a0,iVar20);
      MVar22 = proto2_unittest::TestAllExtensions::GetMetadata
                         ((TestAllExtensions *)proto2_unittest::_TestAllExtensions_default_instance_
                         );
      pcVar19 = ((MVar22.descriptor)->all_names_).payload_;
      value_01._M_len = (ulong)*(ushort *)(pcVar19 + 2);
      (pVVar9->field_0)._impl_._has_bits_.has_bits_[0] =
           (pVVar9->field_0)._impl_._has_bits_.has_bits_[0] | 2;
      pAVar16 = (Arena *)(pVVar9->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar16 & 1) != 0) {
        pAVar16 = *(Arena **)((ulong)pAVar16 & 0xfffffffffffffffe);
      }
      value_01._M_str = pcVar19 + ~value_01._M_len;
      ArenaStringPtr::Set(&(pVVar9->field_0)._impl_.extendee_,value_01,pAVar16);
      local_290.field_memo_table_mutex_.mu_.super___atomic_base<long>._M_i =
           (atomic<long>)(__atomic_base<long>)0x1;
      local_290.field_memo_table_._M_t.
      super___uniq_ptr_impl<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>_>
      .
      super__Head_base<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>,_std::default_delete<absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_>,_true,_true>
            )((long)
              "\", which is not defined. The innermost scope is searched first in name resolution. Consider using a leading \'.\'(i.e., \"."
             + 0x77);
      pcVar19 = ((MVar21.descriptor)->all_names_).payload_;
      local_2f8.super_Message.super_MessageLite._vptr_MessageLite =
           (_func_int **)(ulong)*(ushort *)(pcVar19 + 2);
      local_2f8.super_Message.super_MessageLite._internal_metadata_.ptr_ =
           (intptr_t)(pcVar19 + ~(ulong)local_2f8.super_Message.super_MessageLite._vptr_MessageLite)
      ;
      local_468 = (undefined1  [8])0x1;
      IStack_460.ptr_ =
           (long)
           "\", which is not defined. The innermost scope is searched first in name resolution. Consider using a leading \'.\'(i.e., \"."
           + 0x77;
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)local_368,(lts_20250127 *)&local_290,(AlphaNum *)&local_2f8,
                 (AlphaNum *)local_468,c);
      uVar1 = (pVVar9->field_0)._impl_._has_bits_.has_bits_[0];
      if ((uVar1 & 4) != 0) {
        (pVVar9->field_0)._impl_._has_bits_.has_bits_[0] = uVar1;
        pAVar16 = (Arena *)(pVVar9->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar16 & 1) != 0) {
          pAVar16 = *(Arena **)((ulong)pAVar16 & 0xfffffffffffffffe);
        }
        psVar10 = ArenaStringPtr::Mutable_abi_cxx11_(&(pVVar9->field_0)._impl_.type_name_,pAVar16);
        uVar4 = local_368._8_8_;
        if (((DescriptorPool *)local_368._8_8_ == (DescriptorPool *)0x0) ||
           (((ulong)local_368._8_8_ <= (DescriptorPool *)psVar10->_M_string_length &&
            (iVar7 = bcmp((psVar10->_M_dataplus)._M_p,(void *)local_368._0_8_,local_368._8_8_),
            iVar7 == 0)))) {
          c = (AlphaNum *)&DAT_00000014;
          std::__cxx11::string::replace((ulong)psVar10,0,(char *)uVar4,0x11411f8);
        }
      }
      if ((undefined1 *)local_368._0_8_ != local_368 + 0x10) {
        operator_delete((void *)local_368._0_8_,CONCAT71(local_368._17_7_,local_368[0x10]) + 1);
      }
      iVar20 = iVar20 + 1;
    } while (iVar20 < local_1a0[0].current_size_);
  }
  underlay = DescriptorPool::generated_pool();
  DescriptorPool::DescriptorPool(&local_290,underlay);
  this_00 = DescriptorPool::BuildFile(&local_290,(FileDescriptorProto *)local_218);
  local_468[0] = (internal)(this_00 != (FileDescriptor *)0x0);
  IStack_460.ptr_ = 0;
  if (this_00 == (FileDescriptor *)0x0) {
    testing::Message::Message((Message *)local_368);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_2f8,(internal *)local_468,(AssertionResult *)0x10faf95,"false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_328,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x4d7,(char *)local_2f8.super_Message.super_MessageLite._vptr_MessageLite);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_328,(Message *)local_368);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_328);
    if ((anon_union_88_1_493b367e_for_TestDynamicExtensions_10 *)
        local_2f8.super_Message.super_MessageLite._vptr_MessageLite != &local_2f8.field_0) {
      operator_delete(local_2f8.super_Message.super_MessageLite._vptr_MessageLite,
                      local_2f8.field_0._0_8_ + 1);
    }
    if ((long *)local_368._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_368._0_8_ + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)IStack_460.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&IStack_460,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   IStack_460.ptr_);
    }
    goto LAB_0069f89b;
  }
  DynamicMessageFactory::DynamicMessageFactory((DynamicMessageFactory *)local_368,&local_290);
  local_368[0x10] = '\x01';
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  local_388._M_string_length = 0;
  local_388.field_2._M_local_buf[0] = '\0';
  proto2_unittest::TestDynamicExtensions::TestDynamicExtensions(&local_2f8,(Arena *)0x0);
  proto2_unittest::TestDynamicExtensions::TestDynamicExtensions
            ((TestDynamicExtensions *)local_468,(Arena *)0x0);
  local_438[2]._8_4_ = 0x7b;
  local_458._0_8_ = local_458._0_8_ | 4;
  bVar5 = ValidateEnum(5,(uint32_t *)proto2_unittest::ForeignEnum_internal_data_);
  if (!bVar5) {
    __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::proto2_unittest::ForeignEnum_internal_data_)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/unittest.pb.h"
                  ,0x10208,
                  "void proto2_unittest::TestDynamicExtensions::_internal_set_enum_extension(::proto2_unittest::ForeignEnum)"
                 );
  }
  local_438[2]._12_4_ = 5;
  local_458._0_8_ = local_458._0_8_ | 8;
  bVar5 = ValidateEnum(0x89a,(uint32_t *)
                             &proto2_unittest::TestDynamicExtensions_DynamicEnumType_internal_data_)
  ;
  if (!bVar5) {
    __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::proto2_unittest::TestDynamicExtensions_DynamicEnumType_internal_data_)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/unittest.pb.h"
                  ,0x10227,
                  "void proto2_unittest::TestDynamicExtensions::_internal_set_dynamic_enum_extension(::proto2_unittest::TestDynamicExtensions_DynamicEnumType)"
                 );
  }
  local_408 = 0x89a;
  local_458._0_8_ = local_458._0_8_ | 0x11;
  if ((DynamicMessageFactory *)local_438[1]._8_8_ == (DynamicMessageFactory *)0x0) {
    IVar17.ptr_ = IStack_460.ptr_;
    if ((IStack_460.ptr_ & 1U) != 0) {
      IVar17.ptr_ = *(undefined8 *)(IStack_460.ptr_ & 0xfffffffffffffffe);
    }
    local_438[1]._8_8_ =
         Arena::DefaultConstruct<proto2_unittest::ForeignMessage>((Arena *)IVar17.ptr_);
  }
  *(undefined4 *)
   &(((flat_hash_map<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>_>
       *)((long)(local_438[1]._8_8_ + 0x10) + 8))->
    super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>_>
    ).
    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_
       = 0x1c8;
  *(byte *)(local_438[1]._8_8_ + 0x10) = *(bool *)(local_438[1]._8_8_ + 0x10) | 1;
  local_458._0_8_ = local_458._0_8_ | 2;
  if ((TestDynamicExtensions_DynamicMessageType *)local_438[2]._0_8_ ==
      (TestDynamicExtensions_DynamicMessageType *)0x0) {
    IVar17.ptr_ = IStack_460.ptr_;
    if ((IStack_460.ptr_ & 1U) != 0) {
      IVar17.ptr_ = *(undefined8 *)(IStack_460.ptr_ & 0xfffffffffffffffe);
    }
    local_438[2]._0_8_ =
         Arena::DefaultConstruct<proto2_unittest::TestDynamicExtensions_DynamicMessageType>
                   ((Arena *)IVar17.ptr_);
  }
  (((anon_union_12_1_493b367e_for_TestDynamicExtensions_DynamicMessageType_3 *)
   (local_438[2]._0_8_ + 0x10))->_impl_).dynamic_field_ = 0x315;
  *(byte *)(local_438[2]._0_8_ + 0x10) = *(byte *)(local_438[2]._0_8_ + 0x10) | 1;
  AddToRepeatedPtrField<char_const(&)[4]>
            ((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(local_458 + 8),(char (*) [4])0x11364a4);
  AddToRepeatedPtrField<char_const(&)[4]>
            ((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(local_458 + 8),(char (*) [4])0x1260a11);
  RepeatedField<int>::Add((RepeatedField<int> *)&local_438[0].long_rep,0xc);
  RepeatedField<int>::Add((RepeatedField<int> *)&local_438[0].long_rep,-0x22);
  RepeatedField<int>::Add((RepeatedField<int> *)&local_438[0].long_rep,0x38);
  RepeatedField<int>::Add((RepeatedField<int> *)&local_438[0].long_rep,-0x4e);
  if ((IStack_460.ptr_ & 1U) == 0) {
    pUVar18 = InternalMetadata::mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                        (&IStack_460);
  }
  else {
    pUVar18 = (UnknownFieldSet *)((IStack_460.ptr_ & 0xfffffffffffffffeU) + 8);
  }
  UnknownFieldSet::AddVarint(pUVar18,0x7d2,0x3039);
  if ((IStack_460.ptr_ & 1U) == 0) {
    pUVar18 = InternalMetadata::mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                        (&IStack_460);
  }
  else {
    pUVar18 = (UnknownFieldSet *)((IStack_460.ptr_ & 0xfffffffffffffffeU) + 8);
  }
  psVar10 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_(pUVar18,0xd431);
  std::__cxx11::string::_M_replace((ulong)psVar10,0,(char *)psVar10->_M_string_length,0x114120d);
  MessageLite::SerializeToString((MessageLite *)local_468,&local_388);
  proto2_unittest::TestDynamicExtensions::CopyFrom(&local_2f8,(TestDynamicExtensions *)local_468);
  proto2_unittest::TestDynamicExtensions::~TestDynamicExtensions((TestDynamicExtensions *)local_468)
  ;
  proto2_unittest::TestAllExtensions::TestAllExtensions(&local_328,(Arena *)0x0);
  io::ArrayInputStream::ArrayInputStream
            ((ArrayInputStream *)local_3d8,local_388._M_dataplus._M_p,
             (int)local_388._M_string_length,-1);
  local_468 = (undefined1  [8])0x0;
  IStack_460.ptr_ = 0;
  local_458[8] = '\0';
  local_458[9] = '\0';
  local_458[10] = '\0';
  local_458[0xb] = '\0';
  local_458[0xc] = '\0';
  local_458[0xd] = '\0';
  local_458[0xe] = '\0';
  local_458[0xf] = '\0';
  local_458._16_4_ = 0;
  local_458[0x14] = '\0';
  local_458[0x15] = '\0';
  local_458[0x16] = '\0';
  local_458._24_8_ = &DAT_7fffffff;
  local_438[0].long_rep.elements_int._0_4_ = 0x7fffffff;
  local_438[0].long_rep.elements_int._4_4_ = io::CodedInputStream::default_recursion_limit_;
  local_438[0].long_rep.size = io::CodedInputStream::default_recursion_limit_;
  local_438[1]._0_8_ = 0;
  local_438[1]._8_8_ = (ForeignMessage *)0x0;
  local_458._0_8_ = (ArrayInputStream *)local_3d8;
  io::CodedInputStream::Refresh((CodedInputStream *)local_468);
  local_438[1]._0_8_ = &local_290;
  local_438[1]._8_8_ = (DynamicMessageFactory *)local_368;
  bVar5 = MessageLite::ParseFromCodedStream((MessageLite *)&local_328,(CodedInputStream *)local_468)
  ;
  local_498[0] = bVar5;
  local_490 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar5) {
LAB_0069ee8d:
    local_498[0] = local_458[0x14];
    local_490 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_458[0x14] == '\0') {
      testing::Message::Message((Message *)&local_4b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_3a8,(internal *)local_498,(AssertionResult *)0x124be39,"false","true",in_R9)
      ;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_3f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                 ,0x503,local_3a8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_3f8,(Message *)&local_4b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p,
                        CONCAT71(local_3a8.field_2._M_allocated_capacity._1_7_,
                                 local_3a8.field_2._M_local_buf[0]) + 1);
      }
      if ((long *)local_4b8._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_4b8._M_dataplus._M_p + 8))();
      }
      if (local_490 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_490,local_490);
      }
      goto LAB_0069f0ba;
    }
    io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_468);
    local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
    local_3a8._M_string_length = 0;
    local_3a8.field_2._M_local_buf[0] = '\0';
    TextFormat::PrintToString(&local_328.super_Message,&local_3a8);
    testing::internal::CmpHelperEQ<char[567],std::__cxx11::string>
              ((internal *)local_468,
               "\"[dynamic_extensions.scalar_extension]: 123\\n\" \"[dynamic_extensions.enum_extension]: FOREIGN_BAR\\n\" \"[dynamic_extensions.dynamic_enum_extension]: DYNAMIC_BAZ\\n\" \"[dynamic_extensions.message_extension] {\\n\" \"  c: 456\\n\" \"}\\n\" \"[dynamic_extensions.dynamic_message_extension] {\\n\" \"  dynamic_field: 789\\n\" \"}\\n\" \"[dynamic_extensions.repeated_extension]: \\\"foo\\\"\\n\" \"[dynamic_extensions.repeated_extension]: \\\"bar\\\"\\n\" \"[dynamic_extensions.packed_extension]: 12\\n\" \"[dynamic_extensions.packed_extension]: -34\\n\" \"[dynamic_extensions.packed_extension]: 56\\n\" \"[dynamic_extensions.packed_extension]: -78\\n\" \"2002: 12345\\n\" \"54321: \\\"unknown\\\"\\n\""
               ,"message_text",
               (char (*) [567])
               "[dynamic_extensions.scalar_extension]: 123\n[dynamic_extensions.enum_extension]: FOREIGN_BAR\n[dynamic_extensions.dynamic_enum_extension]: DYNAMIC_BAZ\n[dynamic_extensions.message_extension] {\n  c: 456\n}\n[dynamic_extensions.dynamic_message_extension] {\n  dynamic_field: 789\n}\n[dynamic_extensions.repeated_extension]: \"foo\"\n[dynamic_extensions.repeated_extension]: \"bar\"\n[dynamic_extensions.packed_extension]: 12\n[dynamic_extensions.packed_extension]: -34\n[dynamic_extensions.packed_extension]: 56\n[dynamic_extensions.packed_extension]: -78\n2002: 12345\n54321: \"unknown\"\n"
               ,&local_3a8);
    if (local_468[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_3d8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)IStack_460.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar19 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar19 = *(char **)IStack_460.ptr_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_498,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                 ,0x51b,pcVar19);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_498,(Message *)local_3d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_498);
      if (local_3d8 != (undefined1  [8])0x0) {
        (**(code **)(*(_func_int **)local_3d8 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)IStack_460.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&IStack_460,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   IStack_460.ptr_);
    }
    MessageLite::SerializeAsString_abi_cxx11_((string *)local_468,(MessageLite *)&local_328);
    bVar5 = TestUtil::EqualsToSerialized<proto2_unittest::TestDynamicExtensions>
                      (&local_2f8,(string *)local_468);
    local_3d8[0] = (internal)bVar5;
    local_3d0.ptr_ = 0;
    if (local_468 != (undefined1  [8])local_458) {
      operator_delete((void *)local_468,(ulong)(local_458._0_8_ + 1));
    }
    if (local_3d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_498);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_468,(internal *)local_3d8,
                 (AssertionResult *)
                 "EqualsToSerialized(dynamic_extension, message.SerializeAsString())","false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_4b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                 ,0x51f,(char *)local_468);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_4b8,(Message *)local_498);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4b8);
      if (local_468 != (undefined1  [8])local_458) {
        operator_delete((void *)local_468,(ulong)(local_458._0_8_ + 1));
      }
      if (local_498 != (undefined1  [8])0x0) {
        (**(code **)(*(_func_int **)local_498 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_3d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_3d0.ptr_);
    }
    proto2_unittest::TestAllExtensions::TestAllExtensions
              ((TestAllExtensions *)local_3d8,(Arena *)0x0);
    io::ArrayInputStream::ArrayInputStream
              ((ArrayInputStream *)local_498,local_388._M_dataplus._M_p,
               (int)local_388._M_string_length,-1);
    local_468 = (undefined1  [8])0x0;
    IStack_460.ptr_ = 0;
    local_458[8] = '\0';
    local_458[9] = '\0';
    local_458[10] = '\0';
    local_458[0xb] = '\0';
    local_458[0xc] = '\0';
    local_458[0xd] = '\0';
    local_458[0xe] = '\0';
    local_458[0xf] = '\0';
    local_458._16_4_ = 0;
    local_458[0x14] = '\0';
    local_458[0x15] = '\0';
    local_458[0x16] = '\0';
    local_458._24_8_ = &DAT_7fffffff;
    local_438[0].long_rep.elements_int._0_4_ = 0x7fffffff;
    local_438[0].long_rep.elements_int._4_4_ = io::CodedInputStream::default_recursion_limit_;
    local_438[0].long_rep.size = io::CodedInputStream::default_recursion_limit_;
    local_438[1]._0_8_ = 0;
    local_438[1]._8_8_ = (ForeignMessage *)0x0;
    local_458._0_8_ = (ArrayInputStream *)local_498;
    io::CodedInputStream::Refresh((CodedInputStream *)local_468);
    local_438[1]._0_8_ = &local_290;
    local_438[1]._8_8_ = (DynamicMessageFactory *)local_368;
    iVar6 = (internal)
            WireFormat::ParseAndMergePartial((CodedInputStream *)local_468,(Message *)local_3d8);
    local_3f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((bool)iVar6) {
LAB_0069f39c:
      local_3f8[0] = (internal)local_458[0x14];
      local_3f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_458[0x14] == '\0') {
        testing::Message::Message(&local_478);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_4b8,(internal *)local_3f8,(AssertionResult *)0x124be39,"false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_400,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                   ,0x528,local_4b8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_400,&local_478);
        testing::internal::AssertHelper::~AssertHelper(&local_400);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
          operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
        }
        if ((long *)CONCAT71(local_478.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._1_7_,
                             local_478.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._0_1_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(local_478.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._1_7_,
                                         local_478.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._0_1_) + 8))();
        }
        if (local_3f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_3f0,local_3f0);
        }
        goto LAB_0069f520;
      }
      Message::DebugString_abi_cxx11_(&local_4b8,&local_328.super_Message);
      Message::DebugString_abi_cxx11_((string *)local_3f8,(Message *)local_3d8);
      testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                ((internal *)&local_478,"message.DebugString()","message2.DebugString()",&local_4b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_3f8._1_7_,local_3f8[0]) != &local_3e8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_3f8._1_7_,local_3f8[0]),
                        local_3e8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
        operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
      }
      if (local_478.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_4b8);
        if (local_470 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar19 = anon_var_dwarf_a12c75 + 5;
        }
        else {
          pcVar19 = (local_470->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_3f8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                   ,0x529,pcVar19);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_3f8,(Message *)&local_4b8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f8);
        if ((long *)local_4b8._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_4b8._M_dataplus._M_p + 8))();
        }
      }
      if (local_470 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_470,local_470);
      }
      io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_468);
      proto2_unittest::TestAllExtensions::~TestAllExtensions((TestAllExtensions *)local_3d8);
      name._M_str = "message_extension";
      name._M_len = 0x11;
      pFVar11 = FileDescriptor::FindExtensionByName(this_00,name);
      local_3d8[0] = (internal)(pFVar11 != (FieldDescriptor *)0x0);
      local_3d0.ptr_ = 0;
      if (pFVar11 == (FieldDescriptor *)0x0) {
        testing::Message::Message((Message *)local_498);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_468,(internal *)local_3d8,(AssertionResult *)0x11417e2,"false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_4b8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                   ,0x530,(char *)local_468);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_4b8,(Message *)local_498);
LAB_0069f714:
        this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3d0;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4b8);
        if (local_468 != (undefined1  [8])local_458) {
          operator_delete((void *)local_468,(ulong)(local_458._0_8_ + 1));
        }
        if (local_498 != (undefined1  [8])0x0) {
          (**(code **)(*(_func_int **)local_498 + 8))();
        }
        IVar17.ptr_ = local_3d0.ptr_;
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
LAB_0069f75c:
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()(this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               IVar17.ptr_);
        }
      }
      else {
        MVar21 = proto2_unittest::TestAllExtensions::GetMetadata
                           ((TestAllExtensions *)
                            proto2_unittest::_TestAllExtensions_default_instance_);
        pMVar12 = Reflection::GetMessage
                            (MVar21.reflection,&local_328.super_Message,pFVar11,
                             (MessageFactory *)0x0);
        lVar13 = (**(code **)(proto2_unittest::_ForeignMessage_default_instance_ + 0x20))();
        iVar20 = (*(pMVar12->super_MessageLite)._vptr_MessageLite[4])(pMVar12);
        auVar3 = local_3d8;
        lVar14 = CONCAT44(extraout_var,iVar20);
        local_3d8[0] = (internal)(lVar13 == lVar14);
        local_3d0.ptr_ = 0;
        if (lVar13 != lVar14) {
          testing::Message::Message((Message *)local_498);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_468,(internal *)local_3d8,
                     (AssertionResult *)"typed_sub_message != nullptr","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_4b8,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                     ,0x535,(char *)local_468);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_4b8,(Message *)local_498);
          goto LAB_0069f714;
        }
        local_3d8._4_4_ = auVar3._4_4_;
        local_3d8._0_4_ = 0x1c8;
        local_498._0_4_ = (int)pMVar12[1].super_MessageLite._internal_metadata_.ptr_;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_468,"456","typed_sub_message->c()",(int *)local_3d8,
                   (int *)local_498);
        if (local_468[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_3d8);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)IStack_460.ptr_
              == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar19 = anon_var_dwarf_a12c75 + 5;
          }
          else {
            pcVar19 = *(char **)IStack_460.ptr_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_498,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                     ,0x536,pcVar19);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_498,(Message *)local_3d8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_498);
          if (local_3d8 != (undefined1  [8])0x0) {
            (**(code **)(*(_func_int **)local_3d8 + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)IStack_460.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&IStack_460,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       IStack_460.ptr_);
        }
        if (lVar13 == lVar14) {
          name_00._M_str = "dynamic_message_extension";
          name_00._M_len = 0x19;
          pFVar11 = FileDescriptor::FindExtensionByName(this_00,name_00);
          local_3d8[0] = (internal)(pFVar11 != (FieldDescriptor *)0x0);
          local_3d0.ptr_ = 0;
          if (pFVar11 == (FieldDescriptor *)0x0) {
            testing::Message::Message((Message *)local_498);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_468,(internal *)local_3d8,
                       (AssertionResult *)"dynamic_message_extension != nullptr","false","true",
                       in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_4b8,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                       ,0x53e,(char *)local_468);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_4b8,(Message *)local_498);
            goto LAB_0069f714;
          }
          MVar21 = Message::GetMetadata
                             ((Message *)proto2_unittest::_TestAllExtensions_default_instance_);
          pAVar15 = (AssertHelperData *)
                    Reflection::GetMessage
                              (MVar21.reflection,
                               (Message *)proto2_unittest::_TestAllExtensions_default_instance_,
                               pFVar11,(MessageFactory *)local_368);
          type = FieldDescriptor::message_type(pFVar11);
          local_3d8 = (undefined1  [8])
                      DynamicMessageFactory::GetPrototype((DynamicMessageFactory *)local_368,type);
          local_498 = (undefined1  [8])pAVar15;
          testing::internal::
          CmpHelperEQ<google::protobuf::Message_const*,google::protobuf::Message_const*>
                    ((internal *)local_468,"prototype","&sub_message",(Message **)local_3d8,
                     (Message **)local_498);
          if (local_468[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_498);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)IStack_460.ptr_
                == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar19 = anon_var_dwarf_a12c75 + 5;
            }
            else {
              pcVar19 = *(char **)IStack_460.ptr_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_4b8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                       ,0x544,pcVar19);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_4b8,(Message *)local_498);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4b8);
            if (local_498 != (undefined1  [8])0x0) {
              (**(code **)(*(_func_int **)local_498 + 8))();
            }
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)IStack_460.ptr_
              == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          goto LAB_0069f82a;
          this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&IStack_460;
          IVar17.ptr_ = IStack_460.ptr_;
          goto LAB_0069f75c;
        }
      }
    }
    else {
      local_3f8[0] = iVar6;
      testing::Message::Message(&local_478);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_4b8,(internal *)local_3f8,
                 (AssertionResult *)"WireFormat::ParseAndMergePartial(&input, &message2)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_400,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                 ,0x527,local_4b8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_400,&local_478);
      testing::internal::AssertHelper::~AssertHelper(&local_400);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
        operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT71(local_478.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._1_7_,
                           local_478.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_1_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_478.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._1_7_,
                                       local_478.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_1_) + 8))();
      }
      if (local_3f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_3f0,local_3f0);
      }
      if ((bool)iVar6) goto LAB_0069f39c;
LAB_0069f520:
      io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_468);
      proto2_unittest::TestAllExtensions::~TestAllExtensions((TestAllExtensions *)local_3d8);
    }
LAB_0069f82a:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p,
                      CONCAT71(local_3a8.field_2._M_allocated_capacity._1_7_,
                               local_3a8.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    testing::Message::Message((Message *)&local_4b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3a8,(internal *)local_498,
               (AssertionResult *)"message.ParseFromCodedStream(&input)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x502,local_3a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f8,(Message *)&local_4b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p,
                      CONCAT71(local_3a8.field_2._M_allocated_capacity._1_7_,
                               local_3a8.field_2._M_local_buf[0]) + 1);
    }
    if ((long *)local_4b8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_4b8._M_dataplus._M_p + 8))();
    }
    if (local_490 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_490,local_490);
    }
    if (bVar5) goto LAB_0069ee8d;
LAB_0069f0ba:
    io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_468);
  }
  proto2_unittest::TestAllExtensions::~TestAllExtensions(&local_328);
  proto2_unittest::TestDynamicExtensions::~TestDynamicExtensions(&local_2f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,
                    CONCAT71(local_388.field_2._M_allocated_capacity._1_7_,
                             local_388.field_2._M_local_buf[0]) + 1);
  }
  DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)local_368);
LAB_0069f89b:
  DescriptorPool::~DescriptorPool(&local_290);
  DescriptorProto::~DescriptorProto((DescriptorProto *)local_120);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_218);
  return;
}

Assistant:

TEST(ExtensionSetTest, DynamicExtensions) {
  // Test adding a dynamic extension to a compiled-in message object.

  FileDescriptorProto dynamic_proto;
  unittest::TestDynamicExtensions::descriptor()->file()->CopyHeadingTo(
      &dynamic_proto);
  dynamic_proto.clear_dependency();
  dynamic_proto.set_name("dynamic_extensions_test.proto");
  dynamic_proto.add_dependency(
      unittest::TestAllExtensions::descriptor()->file()->name());
  dynamic_proto.set_package("dynamic_extensions");

  // Copy the fields and nested types from TestDynamicExtensions into our new
  // proto, converting the fields into extensions.
  const Descriptor* template_descriptor =
      unittest::TestDynamicExtensions::descriptor();
  DescriptorProto template_descriptor_proto;
  template_descriptor->CopyTo(&template_descriptor_proto);
  dynamic_proto.mutable_message_type()->MergeFrom(
      template_descriptor_proto.nested_type());
  dynamic_proto.mutable_enum_type()->MergeFrom(
      template_descriptor_proto.enum_type());
  dynamic_proto.mutable_extension()->MergeFrom(
      template_descriptor_proto.field());

  // For each extension that we added...
  for (int i = 0; i < dynamic_proto.extension_size(); i++) {
    // Set its extendee to TestAllExtensions.
    FieldDescriptorProto* extension = dynamic_proto.mutable_extension(i);
    extension->set_extendee(
        unittest::TestAllExtensions::descriptor()->full_name());

    // If the field refers to one of the types nested in TestDynamicExtensions,
    // make it refer to the type in our dynamic proto instead.
    std::string prefix =
        absl::StrCat(".", template_descriptor->full_name(), ".");
    if (extension->has_type_name()) {
      std::string* type_name = extension->mutable_type_name();
      if (absl::StartsWith(*type_name, prefix)) {
        type_name->replace(0, prefix.size(), ".dynamic_extensions.");
      }
    }
  }

  // Now build the file, using the generated pool as an underlay.
  DescriptorPool dynamic_pool(DescriptorPool::generated_pool());
  const FileDescriptor* file = dynamic_pool.BuildFile(dynamic_proto);
  ASSERT_TRUE(file != nullptr);
  DynamicMessageFactory dynamic_factory(&dynamic_pool);
  dynamic_factory.SetDelegateToGeneratedFactory(true);

  // Construct a message that we can parse with the extensions we defined.
  // Since the extensions were based off of the fields of TestDynamicExtensions,
  // we can use that message to create this test message.
  std::string data;
  unittest::TestDynamicExtensions dynamic_extension;
  {
    unittest::TestDynamicExtensions message;
    message.set_scalar_extension(123);
    message.set_enum_extension(unittest::FOREIGN_BAR);
    message.set_dynamic_enum_extension(
        unittest::TestDynamicExtensions::DYNAMIC_BAZ);
    message.mutable_message_extension()->set_c(456);
    message.mutable_dynamic_message_extension()->set_dynamic_field(789);
    message.add_repeated_extension("foo");
    message.add_repeated_extension("bar");
    message.add_packed_extension(12);
    message.add_packed_extension(-34);
    message.add_packed_extension(56);
    message.add_packed_extension(-78);

    // Also add some unknown fields.

    // An unknown enum value (for a known field).
    message.mutable_unknown_fields()->AddVarint(
        unittest::TestDynamicExtensions::kDynamicEnumExtensionFieldNumber,
        12345);
    // A regular unknown field.
    message.mutable_unknown_fields()->AddLengthDelimited(54321, "unknown");

    message.SerializeToString(&data);
    dynamic_extension = message;
  }

  // Now we can parse this using our dynamic extension definitions...
  unittest::TestAllExtensions message;
  {
    io::ArrayInputStream raw_input(data.data(), data.size());
    io::CodedInputStream input(&raw_input);
    input.SetExtensionRegistry(&dynamic_pool, &dynamic_factory);
    ASSERT_TRUE(message.ParseFromCodedStream(&input));
    ASSERT_TRUE(input.ConsumedEntireMessage());
  }

  // Can we print it?
  std::string message_text;
  TextFormat::PrintToString(message, &message_text);
  EXPECT_EQ(
      "[dynamic_extensions.scalar_extension]: 123\n"
      "[dynamic_extensions.enum_extension]: FOREIGN_BAR\n"
      "[dynamic_extensions.dynamic_enum_extension]: DYNAMIC_BAZ\n"
      "[dynamic_extensions.message_extension] {\n"
      "  c: 456\n"
      "}\n"
      "[dynamic_extensions.dynamic_message_extension] {\n"
      "  dynamic_field: 789\n"
      "}\n"
      "[dynamic_extensions.repeated_extension]: \"foo\"\n"
      "[dynamic_extensions.repeated_extension]: \"bar\"\n"
      "[dynamic_extensions.packed_extension]: 12\n"
      "[dynamic_extensions.packed_extension]: -34\n"
      "[dynamic_extensions.packed_extension]: 56\n"
      "[dynamic_extensions.packed_extension]: -78\n"
      "2002: 12345\n"
      "54321: \"unknown\"\n",
      message_text);

  // Can we serialize it?
  EXPECT_TRUE(
      EqualsToSerialized(dynamic_extension, message.SerializeAsString()));

  // What if we parse using the reflection-based parser?
  {
    unittest::TestAllExtensions message2;
    io::ArrayInputStream raw_input(data.data(), data.size());
    io::CodedInputStream input(&raw_input);
    input.SetExtensionRegistry(&dynamic_pool, &dynamic_factory);
    ASSERT_TRUE(WireFormat::ParseAndMergePartial(&input, &message2));
    ASSERT_TRUE(input.ConsumedEntireMessage());
    EXPECT_EQ(message.DebugString(), message2.DebugString());
  }

  // Are the embedded generated types actually using the generated objects?
  {
    const FieldDescriptor* message_extension =
        file->FindExtensionByName("message_extension");
    ASSERT_TRUE(message_extension != nullptr);
    const Message& sub_message =
        message.GetReflection()->GetMessage(message, message_extension);
    const unittest::ForeignMessage* typed_sub_message =
        google::protobuf::DynamicCastMessage<unittest::ForeignMessage>(&sub_message);
    ASSERT_TRUE(typed_sub_message != nullptr);
    EXPECT_EQ(456, typed_sub_message->c());
  }

  // What does GetMessage() return for the embedded dynamic type if it isn't
  // present?
  {
    const FieldDescriptor* dynamic_message_extension =
        file->FindExtensionByName("dynamic_message_extension");
    ASSERT_TRUE(dynamic_message_extension != nullptr);
    const Message& parent = unittest::TestAllExtensions::default_instance();
    const Message& sub_message = parent.GetReflection()->GetMessage(
        parent, dynamic_message_extension, &dynamic_factory);
    const Message* prototype =
        dynamic_factory.GetPrototype(dynamic_message_extension->message_type());
    EXPECT_EQ(prototype, &sub_message);
  }
}